

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O2

void __thiscall ear::OutputGainsT<float>::check_size(OutputGainsT<float> *this,size_t n)

{
  invalid_argument *this_00;
  allocator<char> local_39;
  string local_38;
  
  if ((long)(this->vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 == n) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"incorrect size for output vector",&local_39);
  invalid_argument::invalid_argument(this_00,&local_38);
  __cxa_throw(this_00,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual void check_size(size_t n) override {
      if (vec.size() != n) {
        throw invalid_argument("incorrect size for output vector");
      }
    }